

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O2

FIOBJ fiobj_hash_pop(FIOBJ hash,FIOBJ *key)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  FIOBJ o;
  ulong uVar4;
  fio_hash___couplet_s fVar5;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0xdb,"FIOBJ fiobj_hash_pop(FIOBJ, FIOBJ *)");
  }
  uVar4 = hash & 0xfffffffffffffff8;
  if (*(long *)(uVar4 + 8) == 0) {
    fVar5 = fio_hash___last((fio_hash___s *)(uVar4 + 8));
    o = fVar5.obj;
    fiobj_dup(o);
    if (key != (FIOBJ *)0x0) {
      fVar5 = fio_hash___last((fio_hash___s *)(uVar4 + 8));
      fiobj_dup(fVar5.key);
      *key = fVar5.key;
    }
    if ((*(long *)(uVar4 + 0x20) != 0) && (*(long *)(uVar4 + 0x18) != 0)) {
      fiobj_free(*(FIOBJ *)(*(long *)(uVar4 + 0x20) + -0x10 + *(long *)(uVar4 + 0x18) * 0x18));
      lVar1 = *(long *)(uVar4 + 0x20);
      lVar2 = *(long *)(uVar4 + 0x18) * 0x18;
      *(undefined8 *)(lVar1 + -0x10 + lVar2) = 0;
      fiobj_free(*(FIOBJ *)(lVar1 + -8 + lVar2));
      lVar1 = *(long *)(uVar4 + 0x18);
      lVar2 = *(long *)(uVar4 + 0x20) + lVar1 * 0x18;
      plVar3 = (long *)(lVar2 + -0x30);
      *(undefined8 *)(lVar2 + -8) = 0;
      *(undefined8 *)(lVar2 + -0x18) = 0;
      *(long *)(uVar4 + 8) = *(long *)(uVar4 + 8) + -1;
      do {
        lVar1 = lVar1 + -1;
        if (lVar1 == 0) break;
        lVar2 = *plVar3;
        plVar3 = plVar3 + -3;
      } while (lVar2 == 0);
      *(long *)(uVar4 + 0x18) = lVar1;
    }
  }
  else {
    o = 0;
  }
  return o;
}

Assistant:

FIOBJ fiobj_hash_pop(FIOBJ hash, FIOBJ *key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old;
  if (fio_hash___count(&obj2hash(hash)->hash))
    return FIOBJ_INVALID;
  old = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).obj);
  if (key)
    *key = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).key);
  fio_hash___pop(&obj2hash(hash)->hash);
  return old;
}